

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns.c
# Opt level: O0

int g(sunrealtype t,N_Vector y,sunrealtype *gout,void *user_data)

{
  double dVar1;
  sunrealtype y3;
  sunrealtype y1;
  void *user_data_local;
  sunrealtype *gout_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  *gout = **(double **)((long)y->content + 0x10) - 0.0001;
  gout[1] = dVar1 - 0.01;
  return 0;
}

Assistant:

static int g(sunrealtype t, N_Vector y, sunrealtype* gout, void* user_data)
{
  sunrealtype y1, y3;

  y1      = Ith(y, 1);
  y3      = Ith(y, 3);
  gout[0] = y1 - SUN_RCONST(0.0001);
  gout[1] = y3 - SUN_RCONST(0.01);

  return (0);
}